

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostore.c
# Opt level: O3

int ostore_getObjectIdFromIndex(TOStoreHnd store,uint32_t objectIndex,TOStoreObjID *id)

{
  int iVar1;
  uint32_t i;
  uint uVar2;
  uint32_t position;
  TDskObjIndex header;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (store == (TOStoreHnd)0x0) {
    __assert_fail("store != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/woodsmc[P]ostore/ostore/ostore.c"
                  ,200,"int ostore_getObjectIdFromIndex(TOStoreHnd, uint32_t, TOStoreObjID *)");
  }
  if (id != (TOStoreObjID *)0x0) {
    if (store->numberOfObjects <= objectIndex) {
      __assert_fail("objectIndex < store->numberOfObjects",
                    "/workspace/llm4binary/github/license_c_cmakelists/woodsmc[P]ostore/ostore/ostore.c"
                    ,0xcc,"int ostore_getObjectIdFromIndex(TOStoreHnd, uint32_t, TOStoreObjID *)");
    }
    uVar2 = 0;
    position = 4;
    while( true ) {
      local_48 = 0;
      uStack_40 = 0;
      iVar1 = readWithIndex(store,&(store->tableOfObjectsHeader).header,position,0x10,&local_48);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (objectIndex == uVar2) break;
      uVar2 = uVar2 + 1;
      position = position + 0x10;
      if (store->numberOfObjects <= uVar2) {
        return 0;
      }
    }
    *id = (TOStoreObjID)local_48;
    return 0;
  }
  __assert_fail("id != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/woodsmc[P]ostore/ostore/ostore.c"
                ,0xc9,"int ostore_getObjectIdFromIndex(TOStoreHnd, uint32_t, TOStoreObjID *)");
}

Assistant:

int ostore_getObjectIdFromIndex(TOStoreHnd store, uint32_t objectIndex, TOStoreObjID* id) {
    assert(store != NULL);
    assert(id != NULL);

    START;
    assert(objectIndex < store->numberOfObjects);
    uint32_t offset = sizeof(uint32_t);

    retval = ERR_NOT_FOUND;
    for(uint32_t i = 0; i < store->numberOfObjects; i++) {
        LOCAL_MEMZ(TDskObjIndex, header);
        offset = (i * sizeof(TDskObjIndex)) + sizeof(uint32_t);
        retval = readWithIndex(store, &store->tableOfObjectsHeader.header, offset, sizeof(TDskObjIndex), &header);
        IF_NOT_OK_HANDLE_ERROR(retval);
        if (i == objectIndex) {
            (*id) = header.id;
            break;
        }
    }

    PROCESS_ERROR;

    FINISH;
}